

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O3

Aig_Man_t * Fra_LcrDeriveAigForPartitioning(Fra_Lcr_t *pLcr)

{
  long *plVar1;
  int *piVar2;
  uint uVar3;
  long lVar4;
  Aig_Man_t *pAVar5;
  Aig_Obj_t *p1;
  Vec_Ptr_t *pVVar6;
  Fra_Cla_t *pFVar7;
  int iVar8;
  undefined8 *puVar9;
  Aig_Obj_t *pAVar10;
  
  pAVar5 = pLcr->pAig;
  pVVar6 = pAVar5->vCis;
  if (0 < pVVar6->nSize) {
    lVar4 = 0;
    do {
      plVar1 = (long *)pVVar6->pArray[lVar4];
      plVar1[5] = (long)pLcr;
      *plVar1 = lVar4;
      lVar4 = lVar4 + 1;
      pAVar5 = pLcr->pAig;
      pVVar6 = pAVar5->vCis;
    } while (lVar4 < pVVar6->nSize);
  }
  iVar8 = pAVar5->nObjs[3] - pAVar5->nObjs[2];
  Aig_ManCleanData(pAVar5);
  pAVar5 = Aig_ManStartFrom(pLcr->pAig);
  pFVar7 = pLcr->pCla;
  pVVar6 = pFVar7->vClasses;
  if (0 < pVVar6->nSize) {
    lVar4 = 0;
    do {
      puVar9 = (undefined8 *)pVVar6->pArray[lVar4];
      pAVar10 = (Aig_Obj_t *)((ulong)pAVar5->pConst1 ^ 1);
      piVar2 = (int *)*puVar9;
      while (piVar2 != (int *)0x0) {
        puVar9 = puVar9 + 1;
        if ((piVar2[6] & 7U) != 2) {
          __assert_fail("Aig_ObjIsCi(ppClass[c])",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraLcr.c"
                        ,0x13e,"Aig_Man_t *Fra_LcrDeriveAigForPartitioning(Fra_Lcr_t *)");
        }
        uVar3 = *piVar2 + iVar8;
        if ((int)uVar3 < 0) goto LAB_00605de2;
        pVVar6 = pLcr->pAig->vCos;
        if (pVVar6->nSize <= (int)uVar3) goto LAB_00605de2;
        p1 = Fra_LcrManDup_rec(pAVar5,pLcr->pAig,
                               (Aig_Obj_t *)
                               (*(ulong *)((long)pVVar6->pArray[uVar3] + 8) & 0xfffffffffffffffe));
        pAVar10 = Aig_Exor(pAVar5,pAVar10,p1);
        piVar2 = (int *)*puVar9;
      }
      Aig_ObjCreateCo(pAVar5,pAVar10);
      lVar4 = lVar4 + 1;
      pFVar7 = pLcr->pCla;
      pVVar6 = pFVar7->vClasses;
    } while (lVar4 < pVVar6->nSize);
  }
  pVVar6 = pFVar7->vClasses1;
  if (0 < pVVar6->nSize) {
    lVar4 = 0;
    do {
      if ((*(uint *)((long)pVVar6->pArray[lVar4] + 0x18) & 7) != 2) {
        __assert_fail("Aig_ObjIsCi(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraLcr.c"
                      ,0x148,"Aig_Man_t *Fra_LcrDeriveAigForPartitioning(Fra_Lcr_t *)");
      }
      uVar3 = *pVVar6->pArray[lVar4] + iVar8;
      if ((int)uVar3 < 0) {
LAB_00605de2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pVVar6 = pLcr->pAig->vCos;
      if (pVVar6->nSize <= (int)uVar3) goto LAB_00605de2;
      pAVar10 = Fra_LcrManDup_rec(pAVar5,pLcr->pAig,
                                  (Aig_Obj_t *)
                                  (*(ulong *)((long)pVVar6->pArray[uVar3] + 8) & 0xfffffffffffffffe)
                                 );
      Aig_ObjCreateCo(pAVar5,pAVar10);
      lVar4 = lVar4 + 1;
      pVVar6 = pLcr->pCla->vClasses1;
    } while (lVar4 < pVVar6->nSize);
  }
  return pAVar5;
}

Assistant:

Aig_Man_t * Fra_LcrDeriveAigForPartitioning( Fra_Lcr_t * pLcr )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjPo, * pObjNew, ** ppClass, * pMiter;
    int i, c, Offset;
    // remember the numbers of the inputs of the original AIG
    Aig_ManForEachCi( pLcr->pAig, pObj, i )
    {
        pObj->pData = pLcr;
        pObj->pNext = (Aig_Obj_t *)(long)i;
    }
    // compute the LO/LI offset
    Offset = Aig_ManCoNum(pLcr->pAig) - Aig_ManCiNum(pLcr->pAig);
    // create the PIs
    Aig_ManCleanData( pLcr->pAig );
    pNew = Aig_ManStartFrom( pLcr->pAig );
    // go over the equivalence classes
    Vec_PtrForEachEntry( Aig_Obj_t **, pLcr->pCla->vClasses, ppClass, i )
    {
        pMiter = Aig_ManConst0(pNew);
        for ( c = 0; ppClass[c]; c++ )
        {
            assert( Aig_ObjIsCi(ppClass[c]) );
            pObjPo  = Aig_ManCo( pLcr->pAig, Offset+(long)ppClass[c]->pNext );
            pObjNew = Fra_LcrManDup_rec( pNew, pLcr->pAig, Aig_ObjFanin0(pObjPo) );
            pMiter  = Aig_Exor( pNew, pMiter, pObjNew );
        }
        Aig_ObjCreateCo( pNew, pMiter );
    }
    // go over the constant candidates
    Vec_PtrForEachEntry( Aig_Obj_t *, pLcr->pCla->vClasses1, pObj, i )
    {
        assert( Aig_ObjIsCi(pObj) );
        pObjPo = Aig_ManCo( pLcr->pAig, Offset+(long)pObj->pNext );
        pMiter = Fra_LcrManDup_rec( pNew, pLcr->pAig, Aig_ObjFanin0(pObjPo) );
        Aig_ObjCreateCo( pNew, pMiter );
    }
    return pNew;
}